

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void __thiscall Catch::RedirectedStdErr::RedirectedStdErr(RedirectedStdErr *this)

{
  ReusableStringStream::ReusableStringStream(&this->m_rss);
  RedirectedStream::RedirectedStream(&this->m_cerr,(ostream *)&std::cerr,(this->m_rss).m_oss);
  RedirectedStream::RedirectedStream(&this->m_clog,(ostream *)&std::clog,(this->m_rss).m_oss);
  return;
}

Assistant:

RedirectedStdErr::RedirectedStdErr()
    :   m_cerr( Catch::cerr(), m_rss.get() ),
        m_clog( Catch::clog(), m_rss.get() )
    {}